

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O1

BDD make_random(int i,int j)

{
  MTBDD high;
  int iVar1;
  uint64_t uVar2;
  BDD a;
  BDD a_00;
  MTBDD MVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  
  if (i == j) {
    uVar2 = xorshift_rand();
    auVar4._8_4_ = (int)(uVar2 >> 0x20);
    auVar4._0_8_ = uVar2;
    auVar4._12_4_ = 0x45300000;
    dVar6 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 5.421010862427522e-20;
    return (ulong)((int)(dVar6 + dVar6 + 0.0) != 0) << 0x3f;
  }
  a = make_random(i + 1,j);
  a_00 = make_random(i + 1,j);
  uVar2 = xorshift_rand();
  auVar5._8_4_ = (int)(uVar2 >> 0x20);
  auVar5._0_8_ = uVar2;
  auVar5._12_4_ = 0x45300000;
  iVar1 = (int)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) *
                5.421010862427522e-20 * 4.0 + 0.0);
  MVar3 = a;
  high = a_00;
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      mtbdd_deref(a_00);
      return a;
    }
    MVar3 = a_00;
    high = a;
    if (iVar1 == 0) {
      mtbdd_deref(a);
      return a_00;
    }
  }
  if (a != a_00) {
    MVar3 = _mtbdd_makenode(i,MVar3,high);
  }
  MVar3 = mtbdd_ref(MVar3);
  mtbdd_deref(a_00);
  mtbdd_deref(a);
  return MVar3;
}

Assistant:

static inline BDD
make_random(int i, int j)
{
    if (i == j) return rng(0, 2) ? sylvan_true : sylvan_false;

    BDD yes = make_random(i+1, j);
    BDD no = make_random(i+1, j);
    BDD result = sylvan_invalid;

    switch(rng(0, 4)) {
    case 0:
        result = no;
        sylvan_deref(yes);
        break;
    case 1:
        result = yes;
        sylvan_deref(no);
        break;
    case 2:
        result = sylvan_ref(sylvan_makenode(i, yes, no));
        sylvan_deref(no);
        sylvan_deref(yes);
        break;
    case 3:
    default:
        result = sylvan_ref(sylvan_makenode(i, no, yes));
        sylvan_deref(no);
        sylvan_deref(yes);
        break;
    }

    return result;
}